

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O3

int SUNQRAdd_CGS2(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  realtype *dotprods;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  realtype rVar4;
  double dVar5;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    dotprods = R + mMax * m;
    N_VDotProdMulti(m,*QRdata,Q,dotprods);
    N_VLinearCombination(m,dotprods,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*(N_Vector *)((long)QRdata + 8));
    N_VDotProdMulti(m,*(N_Vector *)((long)QRdata + 8),Q,*(realtype **)((long)QRdata + 0x10));
    uVar3 = (ulong)(uint)m;
    N_VLinearCombination(m,*(realtype **)((long)QRdata + 0x10),Q,Q[uVar3]);
    N_VLinearSum(1.0,*(N_Vector *)((long)QRdata + 8),-1.0,Q[uVar3],*QRdata);
    lVar1 = *(long *)((long)QRdata + 0x10);
    uVar2 = 0;
    do {
      dotprods[uVar2] = dotprods[uVar2] + *(double *)(lVar1 + uVar2 * 8);
      uVar2 = uVar2 + 1;
    } while (uVar3 != uVar2);
  }
  rVar4 = N_VDotProd(*QRdata,*QRdata);
  dVar5 = 0.0;
  if (0.0 < rVar4) {
    rVar4 = N_VDotProd(*QRdata,*QRdata);
    if (rVar4 < 0.0) {
      dVar5 = sqrt(rVar4);
    }
    else {
      dVar5 = SQRT(rVar4);
    }
  }
  R[(mMax + 1) * m] = dVar5;
  N_VScale(1.0 / dVar5,*QRdata,Q[m]);
  return 0;
}

Assistant:

int SUNQRAdd_CGS2(N_Vector *Q, realtype *R, N_Vector df,
                  int m, int mMax, void *QRdata)
{
    sunindextype j;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* temp = df */

    if (m > 0) {
      /* s_k = Q_k-1^T df_aa -- update with sdata as a realtype* array */
      N_VDotProdMulti(m, qrdata->vtemp, Q, R + m * mMax);

      /* y = df - Q_k-1 s_k */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp2);

      /* z_k = Q_k-1^T y */
      N_VDotProdMulti(m, qrdata->vtemp2, Q, qrdata->temp_array);

      /* df = y - Q_k-1 z_k  -- update using N_VLinearCombination */
      N_VLinearCombination(m, qrdata->temp_array, Q, Q[m]);
      N_VLinearSum(ONE, qrdata->vtemp2, -ONE, Q[m], qrdata->vtemp);

      /* R(1:k-1,k) = s_k + z_k */
      for (j = 0; j < m; j++) {
        R[m * mMax + j] = R[m * mMax + j] + qrdata->temp_array[j];
      }
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / R(k,k) */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}